

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O2

int Ssw_ObjSatNum(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *p_00;
  int in_EDX;
  
  p_00 = p->vSatVars;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(p_00,iVar1 + 1,in_EDX);
  if ((-1 < (long)iVar1) && (iVar1 < p_00->nSize)) {
    return p_00->pArray[iVar1];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int  Ssw_ObjSatNum( Ssw_Sat_t * p, Aig_Obj_t * pObj )             { return Vec_IntGetEntry( p->vSatVars, pObj->Id );  }